

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint generateFixedLitLenTree(HuffmanTree *tree)

{
  uint extraout_EAX;
  uint *bitlen;
  long lVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  
  bitlen = (uint *)malloc(0x480);
  if (bitlen != (uint *)0x0) {
    auVar2 = vbroadcastss_avx512f(ZEXT416(8));
    lVar1 = 0;
    do {
      *(undefined1 (*) [64])(bitlen + lVar1) = auVar2;
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x90);
    auVar2 = vbroadcastss_avx512f(ZEXT416(9));
    lVar1 = 0x90;
    do {
      *(undefined1 (*) [64])(bitlen + lVar1) = auVar2;
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x100);
    auVar2 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar3 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar4 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar5 = vpbroadcastd_avx512f(ZEXT416(7));
    lVar1 = 0;
    do {
      auVar6 = vpbroadcastq_avx512f();
      auVar7 = vporq_avx512f(auVar6,auVar2);
      auVar6 = vporq_avx512f(auVar6,auVar3);
      vpcmpuq_avx512f(auVar6,auVar4,1);
      vpcmpuq_avx512f(auVar7,auVar4,1);
      auVar6 = vmovdqu32_avx512f(auVar5);
      *(undefined1 (*) [64])(bitlen + lVar1 + 0x100) = auVar6;
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x20);
    bitlen[0x118] = 8;
    bitlen[0x119] = 8;
    bitlen[0x11a] = 8;
    bitlen[0x11b] = 8;
    bitlen[0x11c] = 8;
    bitlen[0x11d] = 8;
    bitlen[0x11e] = 8;
    bitlen[0x11f] = 8;
    HuffmanTree_makeFromLengths(tree,bitlen,0x120,0xf);
    free(bitlen);
    return extraout_EAX;
  }
  return 0;
}

Assistant:

static unsigned generateFixedLitLenTree(HuffmanTree* tree)
{
  unsigned i, error = 0;
  unsigned* bitlen = (unsigned*)lodepng_malloc(NUM_DEFLATE_CODE_SYMBOLS * sizeof(unsigned));
  if(!bitlen) return 83; /*alloc fail*/

  /*288 possible codes: 0-255=literals, 256=endcode, 257-285=lengthcodes, 286-287=unused*/
  for(i =   0; i <= 143; ++i) bitlen[i] = 8;
  for(i = 144; i <= 255; ++i) bitlen[i] = 9;
  for(i = 256; i <= 279; ++i) bitlen[i] = 7;
  for(i = 280; i <= 287; ++i) bitlen[i] = 8;

  error = HuffmanTree_makeFromLengths(tree, bitlen, NUM_DEFLATE_CODE_SYMBOLS, 15);

  lodepng_free(bitlen);
  return error;
}